

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR1.cpp
# Opt level: O2

void __thiscall LR::loadStr(LR *this,string *in)

{
  ulong uVar1;
  allocator local_51;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  split(&s,in,' ');
  std::__cxx11::string::string((string *)&local_38,"#",&local_51);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->inStr,
             &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_38._M_dataplus._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->status,(int *)&local_38);
  uVar1 = (ulong)((long)s.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)s.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff;
  while( true ) {
    uVar1 = uVar1 - 1;
    if ((int)(uint)uVar1 < 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->inStr,
                s.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + ((uint)uVar1 & 0x7fffffff));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&s);
  return;
}

Assistant:

void LR::loadStr(string &in) {
//    cout << "loadStr..." << endl;
    vector<std::string> s = split(in, ' ');
    inStr.push_back("#");
    status.push_back(0);
    for (int i = s.size() - 1; i >= 0; --i) {
        inStr.push_back(s[i]);
    }
}